

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_vproc.cpp
# Opt level: O0

MPP_RET dec_vproc_update_ref_v2(MppDecVprocCtx *vproc_ctx,MppFrame frm,RK_U32 index)

{
  MppDecVprocCtxImpl *ctx;
  MPP_RET ret;
  RK_U32 index_local;
  MppFrame frm_local;
  MppDecVprocCtx *vproc_ctx_local;
  
  dec_vproc_clr_prev1((MppDecVprocCtxImpl *)vproc_ctx);
  *(undefined4 *)(vproc_ctx + 0x14) = *(undefined4 *)((long)vproc_ctx + 0x94);
  *(RK_U32 *)((long)vproc_ctx + 0x94) = index;
  vproc_ctx[0x15] = vproc_ctx[0x13];
  vproc_ctx[0x13] = frm;
  return MPP_OK;
}

Assistant:

MPP_RET dec_vproc_update_ref_v2(MppDecVprocCtx *vproc_ctx, MppFrame frm, RK_U32 index)
{
    MPP_RET ret = MPP_OK;
    MppDecVprocCtxImpl *ctx = (MppDecVprocCtxImpl *)vproc_ctx;

    dec_vproc_clr_prev1(ctx);

    ctx->prev_idx1 = ctx->prev_idx0;
    ctx->prev_idx0 = index;
    ctx->prev_frm1 = ctx->prev_frm0;
    ctx->prev_frm0 = frm;
    return ret;
}